

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

ssize_t __thiscall
cm::uv_async_ptr::send(uv_async_ptr *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long *plVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  undefined8 *puVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  
  plVar1 = *(long **)(this + 8);
  if (plVar1 == (long *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = (undefined8 *)
             (**(code **)(*plVar1 + 0x20))(plVar1,&uv_handle_deleter<uv_async_s>::typeinfo);
  }
  if (puVar3 != (undefined8 *)0x0) {
    __mutex = (pthread_mutex_t *)*puVar3;
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 == 0) {
      if (*(uv_async_t **)this != (uv_async_t *)0x0) {
        uv_async_send(*(uv_async_t **)this);
      }
      iVar2 = pthread_mutex_unlock(__mutex);
      return CONCAT44(extraout_var,iVar2);
    }
    uVar4 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock(__mutex);
    _Unwind_Resume(uVar4);
  }
  __assert_fail("deleter",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmUVHandlePtr.cxx"
                ,0x9d,"void cm::uv_async_ptr::send()");
}

Assistant:

void uv_async_ptr::send()
{
  auto deleter = std::get_deleter<uv_handle_deleter<uv_async_t>>(this->handle);
  assert(deleter);

  std::lock_guard<std::mutex> lock(*deleter->handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}